

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_NurbsSurface::IsPeriodic(ON_NurbsSurface *this,int dir)

{
  bool bVar1;
  double *pointA;
  double *pointB;
  int j;
  int iVar2;
  int i;
  int iVar3;
  int iVar4;
  
  if ((uint)dir < 2) {
    bVar1 = ON_IsKnotVectorPeriodic
                      (this->m_order[(uint)dir],this->m_cv_count[(uint)dir],this->m_knot[(uint)dir])
    ;
    j = 0;
    if (bVar1) {
      i = this->m_order[(uint)dir] + -2;
      iVar4 = this->m_cv_count[(uint)dir] + -1;
      for (; j < this->m_cv_count[1 - dir]; j = j + 1) {
        if (dir == 0) {
          pointA = CV(this,i,j);
          iVar3 = j;
          iVar2 = iVar4;
        }
        else {
          pointA = CV(this,j,i);
          iVar3 = iVar4;
          iVar2 = j;
        }
        pointB = CV(this,iVar2,iVar3);
        iVar3 = i;
        iVar2 = -1;
        if (i < -1) {
          iVar2 = i;
        }
        for (; i = iVar2, -1 < iVar3; iVar3 = iVar3 + -1) {
          bVar1 = ON_PointsAreCoincident(this->m_dim,this->m_is_rat != 0,pointA,pointB);
          if (!bVar1) {
            j = 0;
            goto LAB_00557086;
          }
          pointA = pointA + -(long)this->m_cv_stride[(uint)dir];
          pointB = pointB + -(long)this->m_cv_stride[(uint)dir];
          iVar4 = iVar4 + -1;
          iVar2 = i;
        }
      }
      j = 1;
    }
LAB_00557086:
    bVar1 = SUB41(j,0);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool 
ON_NurbsSurface::IsPeriodic( int dir ) const
{
  bool bIsPeriodic = false;
  if ( dir >= 0 && dir <= 1 )
  {
    int k;
    bIsPeriodic = ON_IsKnotVectorPeriodic( m_order[dir], m_cv_count[dir], m_knot[dir] );
    if ( bIsPeriodic ) 
    {
      const double *cv0, *cv1;
      int i0 = m_order[dir]-2;
      int i1 = m_cv_count[dir]-1;
      for ( k = 0; k < m_cv_count[1-dir]; k++ )
      {
        cv0 = (dir)?CV(k,i0):CV(i0,k);
        cv1 = (dir)?CV(k,i1):CV(i1,k);
        for ( /*empty*/; i0 >= 0; i0--, i1-- ) 
        {
          if ( false == ON_PointsAreCoincident( m_dim, m_is_rat, cv0, cv1 ) )
            return false;
          cv0 -= m_cv_stride[dir];
          cv1 -= m_cv_stride[dir];      
        }
      }
    }
  }
  return bIsPeriodic;
}